

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RobSubstitution.hpp
# Opt level: O1

Option<Kernel::TermList> __thiscall
Kernel::OnlyMemorizeNonVar<Kernel::TermList>::get
          (OnlyMemorizeNonVar<Kernel::TermList> *this,AutoDerefTermSpec *arg)

{
  Entry *pEVar1;
  Value in_RDX;
  Value extraout_RDX;
  Option<Kernel::TermList> OVar2;
  Option<Kernel::TermSpec> key;
  undefined8 *local_18;
  
  if (((*(ulong *)in_RDX & 3) == 0) &&
     (::Lib::Map<Kernel::TermSpec,_Kernel::TermList,_Lib::DefaultHash>::tryGet
                ((Map<Kernel::TermSpec,_Kernel::TermList,_Lib::DefaultHash> *)&local_18,&arg->term),
     in_RDX = extraout_RDX, local_18 != (undefined8 *)0x0)) {
    pEVar1 = (Entry *)*local_18;
    *(undefined1 *)&(this->_memo)._capacity = 1;
    (this->_memo)._entries = pEVar1;
  }
  else {
    (this->_memo)._capacity = 0;
    (this->_memo)._noOfEntries = 0;
    (this->_memo)._entries = (Entry *)0x0;
  }
  OVar2.super_OptionBase<Kernel::TermList>._elem._elem = in_RDX;
  OVar2.super_OptionBase<Kernel::TermList>._0_8_ = this;
  return (Option<Kernel::TermList>)OVar2.super_OptionBase<Kernel::TermList>;
}

Assistant:

Option<Result> get(AutoDerefTermSpec const& arg)
  { 
    auto key = memoKey(arg);
    return key.isSome()
       ? _memo.tryGet(*key).toOwned()
       : Option<Result>(); 
  }